

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O1

symtbl_t * find_scope_id(symtbl_t *s,int scope_id)

{
  uint uVar1;
  symtbl_t **ppsVar2;
  symtbl_t *psVar3;
  long lVar4;
  
  if (s->scope_id != scope_id) {
    uVar1 = s->num_children;
    if (uVar1 != 0) {
      ppsVar2 = s->children;
      lVar4 = 0;
      do {
        psVar3 = ppsVar2[lVar4];
        if (psVar3->scope_id == scope_id) {
          return psVar3;
        }
        psVar3 = find_scope_id(psVar3,scope_id);
        if (psVar3 != (symtbl_t *)0x0) {
          return psVar3;
        }
        lVar4 = lVar4 + 1;
      } while (uVar1 != (uint)lVar4);
    }
    s = (symtbl_t *)0x0;
  }
  return s;
}

Assistant:

symtbl_t* find_scope_id(symtbl_t* s, int scope_id)
{
    unsigned int i;
    symtbl_t* ret;
    if (s->scope_id == scope_id)
        return s;

    for (i = 0; i < s->num_children; i++)
    {
        if (s->children[i]->scope_id == scope_id)
            return s->children[i];

        ret = find_scope_id(s->children[i], scope_id);
        if (ret)
            return ret;
    }
    return NULL;
}